

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O2

Cnf_Cut_t * Cnf_CutCompose(Cnf_Man_t *p,Cnf_Cut_t *pCut,Cnf_Cut_t *pCutFan,int iFan)

{
  uint *puTruth;
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint *pIn;
  uint *pIn_00;
  uint *pOut;
  uint uVar8;
  uint Phase;
  int *piVar9;
  Cnf_Cut_t *pCut_00;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int nLeaves;
  int iVar14;
  long lVar15;
  long lVar16;
  uint iVar;
  ulong uVar17;
  
  pIn = p->pTruths[0];
  pIn_00 = p->pTruths[2];
  pOut = p->pTruths[3];
  bVar5 = pCut->nFanins;
  uVar17 = 0;
  if ((char)bVar5 < '\x01') {
    bVar5 = 0;
  }
  while( true ) {
    if (bVar5 == uVar17) {
      __assert_fail("iVar < pCut->nFanins",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                    ,0x133,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
    }
    if (*(int *)((long)pCut[1].vIsop + uVar17 * 4 + -8) == iFan) break;
    uVar17 = uVar17 + 1;
  }
  iVar = (uint)uVar17;
  Cnf_CutRemoveIthVar(pCut,iVar,iFan);
  cVar1 = pCut->nFanins;
  nLeaves = 0;
  piVar9 = Cnf_CutCompose::pFanins;
  lVar16 = 0;
  iVar12 = 0;
  iVar14 = 0;
  do {
    if ((cVar1 <= iVar12) || (pCutFan->nFanins <= iVar14)) {
      lVar13 = (long)iVar14;
      for (lVar15 = (long)iVar12; lVar15 < (int)cVar1; lVar15 = lVar15 + 1) {
        *piVar9 = *(int *)((long)pCut[1].vIsop + lVar15 * 4 + -8);
        lVar16 = lVar16 + 0x100000000;
        nLeaves = nLeaves + 1;
        piVar9 = piVar9 + 1;
      }
      cVar1 = pCutFan->nFanins;
      for (; lVar13 < cVar1; lVar13 = lVar13 + 1) {
        *piVar9 = *(int *)((long)pCutFan[1].vIsop + lVar13 * 4 + -8);
        lVar16 = lVar16 + 0x100000000;
        nLeaves = nLeaves + 1;
        piVar9 = piVar9 + 1;
      }
      if (nLeaves < p->nMergeLimit) {
        pCut_00 = Cnf_CutAlloc(p,nLeaves);
        memcpy(pCut_00 + 1,Cnf_CutCompose::pFanins,lVar16 >> 0x1e);
        cVar1 = pCut_00->nFanins;
        iVar12 = (int)cVar1;
        cVar2 = pCut->nFanins;
        cVar3 = pCutFan->nFanins;
        if ((int)cVar3 + (int)cVar2 < iVar12) {
          __assert_fail("pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                        ,0x140,
                        "Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
        }
        sVar4 = pCut_00->nWords;
        uVar8 = sVar4 * 2;
        uVar11 = 0;
        uVar17 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar17 = uVar11;
        }
        for (; uVar17 != uVar11; uVar11 = uVar11 + 1) {
          pIn[uVar11] = *(uint *)((long)pCut[1].vIsop +
                                 ((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                        uVar11 & 0xffffffff) % (long)(int)pCut->nWords & 0xffffffffU
                                 ) * 4 + (long)(int)cVar2 * 4 + -8);
        }
        puTruth = (uint *)((long)pCut_00[1].vIsop + (long)iVar12 * 4 + -8);
        uVar11 = 0;
        uVar17 = (ulong)(uint)(int)sVar4;
        if (sVar4 < 1) {
          uVar17 = uVar11;
        }
        for (; uVar17 != uVar11; uVar11 = uVar11 + 1) {
          pIn_00[uVar11] =
               *(uint *)((long)pCutFan[1].vIsop +
                        ((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                         (long)(int)pCutFan->nWords & 0xffffffffU) * 4 + (long)(int)cVar3 * 4 + -8);
        }
        if ('\x1f' < cVar1) {
          __assert_fail("nBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                        ,0xe4,"unsigned int Kit_BitMask(int)");
        }
        Kit_TruthShrink(pOut,pIn,iVar12,iVar12 + 1,
                        ~(-1 << ((byte)(iVar12 + 1) & 0x1f) | 1 << (iVar & 0x1f)),1);
        uVar8 = Cnf_TruthPhase(pCut_00,pCut);
        bVar5 = pCut_00->nFanins;
        Phase = Cnf_TruthPhase(pCut_00,pCutFan);
        Kit_TruthStretch(pOut,pIn,pCut->nFanins + 1,pCut_00->nFanins + 1,uVar8 | 1 << (bVar5 & 0x1f)
                         ,1);
        Kit_TruthStretch(pOut,pIn_00,(int)pCutFan->nFanins,(int)pCut_00->nFanins,Phase,1);
        sVar4 = pCut_00->nWords;
        uVar17 = 1;
        if ('\x05' < pCut_00->nFanins) {
          uVar17 = (ulong)(uint)(1 << (pCut_00->nFanins - 5U & 0x1f));
        }
        for (lVar16 = 0; 0 < (int)uVar17 + (int)lVar16; lVar16 = lVar16 + -1) {
          *(uint *)((long)pCut_00->vIsop + lVar16 * 4 + (long)iVar12 * 4 + uVar17 * 4 + 0xc) =
               (pIn[uVar17 + (long)sVar4 + lVar16 + -1] ^ pIn[uVar17 + lVar16 + -1]) &
               pIn_00[uVar17 + lVar16 + -1] ^ pIn[uVar17 + lVar16 + -1];
        }
        Cnf_CutInsertIthVar(pCut,iVar,iFan);
        if (pCut_00->nFanins < 5) {
          pCut_00->Cost =
               p->pSopSizes[(ulong)(ushort)*puTruth ^ 0xffff] + p->pSopSizes[(ushort)*puTruth];
        }
        else {
          pVVar10 = (Vec_Int_t *)0x0;
          iVar12 = Kit_TruthIsop(puTruth,(int)pCut_00->nFanins,p->vMemory,0);
          if (iVar12 != -1) {
            pVVar10 = Vec_IntDup(p->vMemory);
          }
          pCut_00->vIsop[1] = pVVar10;
          Kit_TruthNot(puTruth,puTruth,(int)pCut_00->nFanins);
          pVVar10 = (Vec_Int_t *)0x0;
          iVar12 = Kit_TruthIsop(puTruth,(int)pCut_00->nFanins,p->vMemory,0);
          if (iVar12 != -1) {
            pVVar10 = Vec_IntDup(p->vMemory);
          }
          pCut_00->vIsop[0] = pVVar10;
          Kit_TruthNot(puTruth,puTruth,(int)pCut_00->nFanins);
          if (((pCut_00->vIsop[0] == (Vec_Int_t *)0x0) || (pCut_00->vIsop[1] == (Vec_Int_t *)0x0))
             || (iVar12 = pCut_00->vIsop[1]->nSize + pCut_00->vIsop[0]->nSize, 0x7f < iVar12)) {
            pCut_00->Cost = '\x7f';
          }
          else {
            pCut_00->Cost = (char)iVar12;
          }
        }
      }
      else {
        Cnf_CutInsertIthVar(pCut,iVar,iFan);
        pCut_00 = (Cnf_Cut_t *)0x0;
      }
      return pCut_00;
    }
    iVar6 = *(int *)((long)pCut[1].vIsop + (long)iVar12 * 4 + -8);
    iVar7 = *(int *)((long)pCutFan[1].vIsop + (long)iVar14 * 4 + -8);
    if (iVar6 == iVar7) {
      *piVar9 = iVar6;
      iVar12 = iVar12 + 1;
LAB_004402d2:
      iVar14 = iVar14 + 1;
    }
    else {
      if (iVar7 <= iVar6) {
        *piVar9 = iVar7;
        goto LAB_004402d2;
      }
      *piVar9 = iVar6;
      iVar12 = iVar12 + 1;
    }
    lVar16 = lVar16 + 0x100000000;
    nLeaves = nLeaves + 1;
    piVar9 = piVar9 + 1;
  } while( true );
}

Assistant:

Cnf_Cut_t * Cnf_CutCompose( Cnf_Man_t * p, Cnf_Cut_t * pCut, Cnf_Cut_t * pCutFan, int iFan )
{
    Cnf_Cut_t * pCutRes;
    static int pFanins[32];
    unsigned * pTruth, * pTruthFan, * pTruthRes;
    unsigned * pTop = p->pTruths[0], * pFan = p->pTruths[2], * pTemp = p->pTruths[3];
    unsigned uPhase, uPhaseFan;
    int i, iVar, nFanins, RetValue;

    // make sure the second cut is the fanin of the first
    for ( iVar = 0; iVar < pCut->nFanins; iVar++ )
        if ( pCut->pFanins[iVar] == iFan )
            break;
    assert( iVar < pCut->nFanins );
    // remove this variable
    Cnf_CutRemoveIthVar( pCut, iVar, iFan );
    // merge leaves of the cuts
    nFanins = Cnf_CutMergeLeaves( pCut, pCutFan, pFanins );
    if ( nFanins+1 > p->nMergeLimit )
    {
        Cnf_CutInsertIthVar( pCut, iVar, iFan );
        return NULL;
    }
    // create new cut
    pCutRes = Cnf_CutAlloc( p, nFanins );
    memcpy( pCutRes->pFanins, pFanins, sizeof(int) * nFanins );
    assert( pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins );

    // derive its truth table
    // get the truth tables in the composition space
    pTruth    = Cnf_CutTruth(pCut);
    pTruthFan = Cnf_CutTruth(pCutFan);
    pTruthRes = Cnf_CutTruth(pCutRes);
    for ( i = 0; i < 2*pCutRes->nWords; i++ )
        pTop[i] = pTruth[i % pCut->nWords];
    for ( i = 0; i < pCutRes->nWords; i++ )
        pFan[i] = pTruthFan[i % pCutFan->nWords];
    // move the variable to the end
    uPhase = Kit_BitMask( pCutRes->nFanins+1 ) & ~(1 << iVar);
    Kit_TruthShrink( pTemp, pTop, pCutRes->nFanins, pCutRes->nFanins+1, uPhase, 1 );
    // compute the phases
    uPhase    = Cnf_TruthPhase( pCutRes, pCut    ) | (1 << pCutRes->nFanins);
    uPhaseFan = Cnf_TruthPhase( pCutRes, pCutFan );
    // permute truth-tables to the common support
    Kit_TruthStretch( pTemp, pTop, pCut->nFanins+1,  pCutRes->nFanins+1, uPhase,    1 );
    Kit_TruthStretch( pTemp, pFan, pCutFan->nFanins, pCutRes->nFanins,   uPhaseFan, 1 );
    // perform Boolean operation
    Kit_TruthMux( pTruthRes, pTop, pTop+pCutRes->nWords, pFan, pCutRes->nFanins );
    // return the cut to its original condition
    Cnf_CutInsertIthVar( pCut, iVar, iFan );
    // consider the simple case
    if ( pCutRes->nFanins < 5 )
    {
        pCutRes->Cost = p->pSopSizes[0xFFFF & *pTruthRes] + p->pSopSizes[0xFFFF & ~*pTruthRes];
        return pCutRes;
    }

    // derive ISOP for positive phase
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[1] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    // derive ISOP for negative phase
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[0] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );

    // compute the cut cost
    if ( pCutRes->vIsop[0] == NULL || pCutRes->vIsop[1] == NULL )
        pCutRes->Cost = 127;
    else if ( Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]) > 127 )
        pCutRes->Cost = 127;
    else
        pCutRes->Cost = Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]);
    return pCutRes;
}